

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,double value)

{
  size_t sVar1;
  byte *pbVar2;
  byte *pbVar3;
  char buffer [32];
  undefined8 uStack_40;
  byte local_38 [40];
  
  uStack_40 = 0x16c03a;
  sprintf((char *)local_38,"%#.16g");
  uStack_40 = 0x16c042;
  sVar1 = strlen((char *)local_38);
  if (local_38[sVar1 - 1] == 0x30) {
    pbVar2 = local_38 + (sVar1 - 1);
    pbVar3 = pbVar2;
    if (local_38 < pbVar2) {
      do {
        pbVar3 = pbVar2;
        if (*pbVar2 != 0x30) break;
        pbVar2 = pbVar2 + -1;
        pbVar3 = local_38;
      } while (local_38 < pbVar2);
    }
    pbVar2 = pbVar3;
    if (local_38 <= pbVar3) {
      do {
        if (9 < *pbVar2 - 0x30) {
          if (*pbVar2 == 0x2e) {
            pbVar3[2] = 0;
          }
          break;
        }
        pbVar2 = pbVar2 + -1;
      } while (local_38 <= pbVar2);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  uStack_40 = 0x16c091;
  sVar1 = strlen((char *)local_38);
  uStack_40 = 0x16c0a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_38,local_38 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString( double value )
{
   char buffer[32];
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with visual studio 2005 to avoid warning. 
   sprintf_s(buffer, sizeof(buffer), "%#.16g", value); 
#else	
   sprintf(buffer, "%#.16g", value); 
#endif
   char* ch = buffer + strlen(buffer) - 1;
   if (*ch != '0') return buffer; // nothing to truncate, so save time
   while(ch > buffer && *ch == '0'){
     --ch;
   }
   char* last_nonzero = ch;
   while(ch >= buffer){
     switch(*ch){
     case '0':
     case '1':
     case '2':
     case '3':
     case '4':
     case '5':
     case '6':
     case '7':
     case '8':
     case '9':
       --ch;
       continue;
     case '.':
       // Truncate zeroes to save bytes in output, but keep one.
       *(last_nonzero+2) = '\0';
       return buffer;
     default:
       return buffer;
     }
   }
   return buffer;
}